

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_texture_thumbnail.cxx
# Opt level: O1

void __thiscall xray_re::xr_texture_thumbnail::load(xr_texture_thumbnail *this,xr_reader *r)

{
  uint32_t uVar1;
  et_format *peVar2;
  uint32_t *puVar3;
  et_type *peVar4;
  float *pfVar5;
  et_material *peVar6;
  size_t sVar7;
  xr_reader *this_00;
  uint8_t *puVar8;
  uint16_t version;
  bool compressed;
  uint32_t thm_type;
  xr_reader *s;
  short local_28;
  bool local_25;
  int local_24;
  xr_reader *local_20;
  
  sVar7 = xr_reader::r_raw_chunk(r,0x810,&local_28,2);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_texture_thumbnail.cxx"
                  ,0x12,"void xray_re::xr_texture_thumbnail::load(xr_reader &)");
  }
  if (local_28 != 0x12) {
    __assert_fail("version == THM_VERSION_TEXTUREPARAM",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_texture_thumbnail.cxx"
                  ,0x13,"void xray_re::xr_texture_thumbnail::load(xr_reader &)");
  }
  local_25 = false;
  sVar7 = xr_reader::find_chunk(r,0x811,&local_25,true);
  if (sVar7 != 0) {
    this_00 = xr_reader::open_chunk(r,0x811);
    local_20 = this_00;
    if (this_00->m_data <= this_00->m_end) {
      puVar8 = (uint8_t *)operator_new__((long)this_00->m_end - (long)this_00->m_data);
      this->data = puVar8;
      if (this_00->m_data <= this_00->m_end) {
        xr_reader::r_raw(this_00,puVar8,(long)this_00->m_end - (long)this_00->m_data);
        xr_reader::close_chunk(r,&local_20);
        goto LAB_001951c1;
      }
    }
    __assert_fail("m_data <= m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                  ,0x7a,"size_t xray_re::xr_reader::size() const");
  }
LAB_001951c1:
  sVar7 = xr_reader::r_raw_chunk(r,0x813,&local_24,4);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_texture_thumbnail.cxx"
                  ,0x1e,"void xray_re::xr_texture_thumbnail::load(xr_reader &)");
  }
  if (local_24 == 1) {
    sVar7 = xr_reader::find_chunk(r,0x812);
    if (sVar7 != 0) {
      peVar2 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(peVar2 + 1);
      this->fmt = *peVar2;
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      this->flags = *puVar3;
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      this->border_color = *puVar3;
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      this->fade_color = *puVar3;
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      this->fade_amount = *puVar3;
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      this->mip_filter = *puVar3;
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      this->width = *puVar3;
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      this->height = *puVar3;
      sVar7 = xr_reader::find_chunk(r,0x814);
      if (sVar7 != 0) {
        peVar4 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(peVar4 + 1);
        this->type = *peVar4;
      }
      sVar7 = xr_reader::find_chunk(r,0x815);
      if (sVar7 != 0) {
        xr_reader::r_sz(r,&this->detail_name);
        pfVar5 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
        this->detail_scale = *pfVar5;
      }
      sVar7 = xr_reader::find_chunk(r,0x816);
      if (sVar7 != 0) {
        peVar6 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(peVar6 + 1);
        this->material = *peVar6;
        pfVar5 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
        this->material_weight = *pfVar5;
      }
      sVar7 = xr_reader::find_chunk(r,0x817);
      if (sVar7 != 0) {
        pfVar5 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
        this->bump_virtual_height = *pfVar5;
        puVar3 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        uVar1 = *puVar3;
        this->bump_mode = uVar1 + (uVar1 == 0);
        xr_reader::r_sz(r,&this->bump_name);
      }
      sVar7 = xr_reader::find_chunk(r,0x818);
      if (sVar7 != 0) {
        xr_reader::r_sz(r,&this->ext_normal_map_name);
      }
      sVar7 = xr_reader::find_chunk(r,0x819);
      if (sVar7 != 0) {
        puVar8 = (r->field_2).m_p;
        (r->field_2).m_p = puVar8 + 1;
        this->fade_delay = *puVar8;
      }
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_texture_thumbnail.cxx"
                  ,0x22,"void xray_re::xr_texture_thumbnail::load(xr_reader &)");
  }
  __assert_fail("thm_type == THM_TYPE_TEXTURE",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_texture_thumbnail.cxx"
                ,0x1f,"void xray_re::xr_texture_thumbnail::load(xr_reader &)");
}

Assistant:

void xr_texture_thumbnail::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk(THM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == THM_VERSION_TEXTUREPARAM);

	bool compressed = false;
	if (r.find_chunk(THM_CHUNK_DATA, &compressed)) {
		xr_reader* s = r.open_chunk(THM_CHUNK_DATA);
		data = new uint8_t[s->size()];
		s->r_raw(data, s->size());
		r.close_chunk(s);
	}
	uint32_t thm_type;
	if (!r.r_chunk(THM_CHUNK_TYPE, thm_type))
		xr_not_expected();
	xr_assert(thm_type == THM_TYPE_TEXTURE);

	if (!r.find_chunk(THM_CHUNK_TEXTUREPARAM))
		xr_not_expected();
	fmt = static_cast<et_format>(r.r_u32());
	flags = r.r_u32();
	border_color = r.r_u32();
	fade_color = r.r_u32();
	fade_amount = r.r_u32();
	mip_filter = r.r_u32();
	width = r.r_s32();
	height = r.r_s32();
	r.debug_find_chunk();

	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_TYPE)) {
		type = static_cast<et_type>(r.r_u32());
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_DETAIL)) {
		r.r_sz(detail_name);
		detail_scale = r.r_float();
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_MATERIAL)) {
		material = static_cast<et_material>(r.r_u32());
		material_weight = r.r_float();
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_BUMP)) {
		bump_virtual_height = r.r_float();
		bump_mode = static_cast<et_bump_mode>(r.r_u32());
		if (bump_mode == tbm_reserved)
			bump_mode = tbm_none;
		r.r_sz(bump_name);
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_NMAP)) {
		r.r_sz(ext_normal_map_name);
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_FADE)) {
		fade_delay = r.r_u8();
		r.debug_find_chunk();
	}
}